

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTPServer.hpp
# Opt level: O3

ssize_t __thiscall
webfront::http::
Connection<webfront::networking::TCPNetworkingTS,_webfront::fs::Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::JasmineFS>_>
::read(Connection<webfront::networking::TCPNetworkingTS,_webfront::fs::Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::JasmineFS>_>
       *this,int __fd,void *__buf,size_t __nbytes)

{
  ssize_t extraout_RAX;
  ssize_t extraout_RAX_00;
  ssize_t extraout_RAX_01;
  ssize_t sVar1;
  shared_ptr<webfront::http::Connection<webfront::networking::TCPNetworkingTS,_webfront::fs::Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::JasmineFS>_>_>
  self;
  completion_handler_type local_48;
  mutable_buffer local_30;
  element_type *local_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  ::std::
  __shared_ptr<webfront::http::Connection<webfront::networking::TCPNetworkingTS,webfront::fs::Multi<webfront::fs::NativeDebugFS,webfront::fs::IndexFS,webfront::fs::JasmineFS>>,(__gnu_cxx::_Lock_policy)2>
  ::
  __shared_ptr<webfront::http::Connection<webfront::networking::TCPNetworkingTS,webfront::fs::Multi<webfront::fs::NativeDebugFS,webfront::fs::IndexFS,webfront::fs::JasmineFS>>,void>
            ((__shared_ptr<webfront::http::Connection<webfront::networking::TCPNetworkingTS,webfront::fs::Multi<webfront::fs::NativeDebugFS,webfront::fs::IndexFS,webfront::fs::JasmineFS>>,(__gnu_cxx::_Lock_policy)2>
              *)&local_20,
             (__weak_ptr<webfront::http::Connection<webfront::networking::TCPNetworkingTS,_webfront::fs::Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::JasmineFS>_>,_(__gnu_cxx::_Lock_policy)2>
              *)this);
  local_30.data_ = &this->buffer;
  local_30.size_ = 0x2000;
  local_48.self.
  super___shared_ptr<webfront::http::Connection<webfront::networking::TCPNetworkingTS,_webfront::fs::Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::JasmineFS>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = local_20;
  local_48.self.
  super___shared_ptr<webfront::http::Connection<webfront::networking::TCPNetworkingTS,_webfront::fs::Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::JasmineFS>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = local_18;
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_18->_M_use_count = local_18->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_18->_M_use_count = local_18->_M_use_count + 1;
    }
  }
  local_48.this = this;
  ::std::experimental::net::v1::detail::reactive_socket_service_base::
  async_receive<std::experimental::net::v1::mutable_buffer,webfront::http::Connection<webfront::networking::TCPNetworkingTS,webfront::fs::Multi<webfront::fs::NativeDebugFS,webfront::fs::IndexFS,webfront::fs::JasmineFS>>::read()::_lambda(std::error_code,unsigned_long)_1_>
            (&((this->socket).super_basic_socket<std::experimental::net::v1::ip::tcp>.
               super_basic_io_object<std::experimental::net::v1::detail::reactive_socket_service<std::experimental::net::v1::ip::tcp>,_true>
              .service_)->super_reactive_socket_service_base,
             &(this->socket).super_basic_socket<std::experimental::net::v1::ip::tcp>.
              super_basic_io_object<std::experimental::net::v1::detail::reactive_socket_service<std::experimental::net::v1::ip::tcp>,_true>
              .implementation_.super_base_implementation_type,&local_30,0,&local_48);
  sVar1 = extraout_RAX;
  if (local_48.self.
      super___shared_ptr<webfront::http::Connection<webfront::networking::TCPNetworkingTS,_webfront::fs::Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::JasmineFS>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.self.
               super___shared_ptr<webfront::http::Connection<webfront::networking::TCPNetworkingTS,_webfront::fs::Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::JasmineFS>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
    sVar1 = extraout_RAX_00;
  }
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
    sVar1 = extraout_RAX_01;
  }
  return sVar1;
}

Assistant:

void read() {
        auto self(this->shared_from_this());
        socket.async_read_some(Net::Buffer(buffer), [this, self](std::error_code ec, std::size_t bytesTransferred) {
            if (!ec) {
                switch (protocol) {
                case Protocol::HTTP:
                    try {
                        request.parseSomeData(buffer.data(), buffer.data() + bytesTransferred);
                        if (request.completed()) {
                            log::info("Received request {} on {}", request.getMethodName(), request.uri);
                            response = requestHandler.handleRequest(request);
                            log::info("  responding http {}", static_cast<int>(response.statusCode));
                            write();
                            if (response.statusCode == Response::switchingProtocols) protocol = Protocol::HTTPUpgrading;
                        }
                        else
                            read();
                    }
                    catch (const BadRequestException&) {
                        response = Response::getStatusResponse(Response::badRequest);
                        write();
                    }
                    break;

                default: log::warn("Connection is no longer in HTTP protocol. Connection::read() is disabled.");
                }
            }
            else if (ec != Net::Error::OperationAborted)
                connections.stop(self);
        });
    }